

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

GLuint glcts::bitfieldReverse(GLuint input)

{
  GLuint result;
  int iVar1;
  bool bVar2;
  
  result = 0;
  iVar1 = 0x20;
  while( true ) {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) break;
    result = result >> 1 | input & 0x80000000;
    input = input * 2;
  }
  return result;
}

Assistant:

static GLuint bitfieldReverse(GLuint input)
{
	GLuint result = 0;
	for (int i = 0; i < 32; ++i)
	{
		result >>= 1;
		result |= (input & 0x80000000);
		input <<= 1;
	}
	return result;
}